

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Error __thiscall asmjit::StringBuilder::reserve(StringBuilder *this,size_t to)

{
  char *__src;
  char *__dest;
  Error EVar1;
  
  EVar1 = 0;
  if ((this->_capacity < to) && (EVar1 = 1, to < 0xffffffffffffffef)) {
    __dest = (char *)malloc((to + 7 & 0xfffffffffffffff8) + 8);
    if (__dest != (char *)0x0) {
      __src = this->_data;
      memcpy(__dest,__src,this->_length + 1);
      if (this->_canFree != 0) {
        free(__src);
      }
      this->_data = __dest;
      EVar1 = 0;
      this->_capacity = to + 7 | 7;
      this->_canFree = 1;
    }
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error StringBuilder::reserve(size_t to) noexcept {
  if (_capacity >= to)
    return kErrorOk;

  if (to >= IntTraits<size_t>::maxValue() - sizeof(intptr_t) * 2)
    return DebugUtils::errored(kErrorNoHeapMemory);

  to = Utils::alignTo<size_t>(to, sizeof(intptr_t));
  char* newData = static_cast<char*>(Internal::allocMemory(to + sizeof(intptr_t)));

  if (!newData)
    return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(newData, _data, _length + 1);
  if (_canFree)
    Internal::releaseMemory(_data);

  _data = newData;
  _capacity = to + sizeof(intptr_t) - 1;
  _canFree = true;
  return kErrorOk;
}